

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# embed.cc
# Opt level: O1

string * CEscape(string *__return_storage_ptr__,string *str)

{
  byte bVar1;
  char cVar2;
  ulong uVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (str->_M_string_length != 0) {
    uVar3 = 0;
    do {
      bVar1 = (str->_M_dataplus)._M_p[uVar3];
      if (bVar1 < 0xd) {
        if ((bVar1 != 9) && (bVar1 != 10)) goto LAB_00101656;
LAB_00101643:
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      else {
        if ((bVar1 == 0xd) || ((bVar1 == 0x22 || (bVar1 == 0x5c)))) goto LAB_00101643;
LAB_00101656:
        cVar2 = (char)__return_storage_ptr__;
        if (0x5e < (byte)(bVar1 - 0x20)) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          std::__cxx11::string::push_back(cVar2);
          std::__cxx11::string::push_back(cVar2);
        }
        std::__cxx11::string::push_back(cVar2);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < str->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string CEscape(const std::string& str) {
  std::string dest;

  for (size_t i = 0; i < str.size(); ++i) {
    unsigned char ch = str[i];
    switch (ch) {
      case '\n': dest += "\\n"; break;
      case '\r': dest += "\\r"; break;
      case '\t': dest += "\\t"; break;
      case '\"': dest += "\\\""; break;
      case '\\': dest += "\\\\"; break;
      default:
        if (AsciiIsPrint(ch)) {
          dest += ch;
        } else {
          dest += "\\";
          dest += ToDecimalDigit(ch / 64);
          dest += ToDecimalDigit((ch % 64) / 8);
          dest += ToDecimalDigit(ch % 8);
        }
        break;
    }
  }

  return dest;
}